

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,bool is_setter_argument,bool force_present,
          bool singular_if_not_packed,BytesMode bytes_mode)

{
  bool bVar1;
  Type TVar2;
  LogMessage *other;
  long *plVar3;
  size_type *psVar4;
  BytesMode bytes_mode_00;
  undefined7 in_register_00000081;
  undefined3 in_stack_00000009;
  undefined1 local_88 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bytes_mode_00 = (BytesMode)CONCAT71(in_register_00000081,is_setter_argument);
  if (((byte)field & is_setter_argument) == 1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x3db);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_88,
                       "CHECK failed: !(is_setter_argument && force_present): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_50,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_88);
  }
  JSTypeName_abi_cxx11_
            (__return_storage_ptr__,this,options,(FieldDescriptor *)(ulong)_singular_if_not_packed,
             bytes_mode_00);
  if ((*(int *)&options->field_0x4c == 3) &&
     (bVar1 = FieldDescriptor::is_packed((FieldDescriptor *)options), bVar1 || !force_present)) {
    TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
    if (_singular_if_not_packed == 0 && TVar2 == TYPE_BYTES) {
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x35b98a);
    }
    else {
      bVar1 = anon_unknown_0::IsPrimitive(__return_storage_ptr__);
      if (!bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                       ,"!",__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_88);
        if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
          operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
        }
      }
      std::operator+(&local_50,"Array.<",__return_storage_ptr__);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        local_88._16_8_ = *psVar4;
        local_88._24_8_ = plVar3[3];
        local_88._0_8_ = local_88 + 0x10;
      }
      else {
        local_88._16_8_ = *psVar4;
        local_88._0_8_ = (size_type *)*plVar3;
      }
      local_88._8_8_ = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_88);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((byte)field == 0) {
    if (((((!is_setter_argument) && (*(int *)&options->field_0x4c != 2)) &&
         (TVar2 = FieldDescriptor::type((FieldDescriptor *)options), TVar2 != TYPE_ENUM)) &&
        ((*(int *)((options->namespace_prefix).field_2._M_allocated_capacity + 0x8c) != 3 ||
         (TVar2 = FieldDescriptor::type((FieldDescriptor *)options),
         *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) == 10)))) &&
       ((TVar2 = FieldDescriptor::type((FieldDescriptor *)options),
        *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) == 10 &&
        (*(int *)&options->field_0x4c == 1)))) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     "?",__return_storage_ptr__);
      goto LAB_00226553;
    }
  }
  else {
    TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
    if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 10) ||
       (bVar1 = true, *(int *)&options->field_0x4c != 1)) {
      bVar1 = false;
    }
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     "?",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_88);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
    }
    TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
    if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) == 10) &&
       (*(int *)&options->field_0x4c == 1)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  bVar1 = anon_unknown_0::IsPrimitive(__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,"!",
                 __return_storage_ptr__);
LAB_00226553:
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_88);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string JSFieldTypeAnnotation(const GeneratorOptions& options,
                             const FieldDescriptor* field,
                             bool is_setter_argument,
                             bool force_present,
                             bool singular_if_not_packed,
                             BytesMode bytes_mode = BYTES_DEFAULT) {
  GOOGLE_CHECK(!(is_setter_argument && force_present));
  string jstype = JSTypeName(options, field, bytes_mode);

  if (field->is_repeated() &&
      (field->is_packed() || !singular_if_not_packed)) {
    if (field->type() == FieldDescriptor::TYPE_BYTES &&
        bytes_mode == BYTES_DEFAULT) {
      jstype = "(Array<!Uint8Array>|Array<string>)";
    } else {
      if (!IsPrimitive(jstype)) {
        jstype = "!" + jstype;
      }
      jstype = "Array.<" + jstype + ">";
    }
  }

  bool is_null_or_undefined = false;

  if (is_setter_argument) {
    if (SetterAcceptsNull(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }

    if (SetterAcceptsUndefined(options, field)) {
      jstype += "|undefined";
      is_null_or_undefined = true;
    }
  } else if (force_present) {
    // Don't add null or undefined.
  } else {
    if (DeclaredReturnTypeIsNullable(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }
  }

  if (!is_null_or_undefined && !IsPrimitive(jstype)) {
    jstype = "!" + jstype;
  }

  return jstype;
}